

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_ldrddi.cpp
# Opt level: O0

ze_result_t
loader::zeFabricVertexGetSubVerticesExp
          (ze_fabric_vertex_handle_t hVertex,uint32_t *pCount,
          ze_fabric_vertex_handle_t *phSubvertices)

{
  object_t<_ze_fabric_vertex_handle_t_*> *poVar1;
  bool bVar2;
  bad_alloc *anon_var_0;
  ulong local_48;
  size_t i;
  ze_pfnFabricVertexGetSubVerticesExp_t pfnGetSubVerticesExp;
  dditable_t *dditable;
  ze_fabric_vertex_handle_t *pp_Stack_28;
  ze_result_t result;
  ze_fabric_vertex_handle_t *phSubvertices_local;
  uint32_t *pCount_local;
  ze_fabric_vertex_handle_t hVertex_local;
  
  dditable._4_4_ = 0;
  pfnGetSubVerticesExp = *(ze_pfnFabricVertexGetSubVerticesExp_t *)(hVertex + 8);
  if (*(code **)(pfnGetSubVerticesExp + 0x628) == (code *)0x0) {
    hVertex_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    pCount_local = *(uint32_t **)hVertex;
    pp_Stack_28 = phSubvertices;
    phSubvertices_local = (ze_fabric_vertex_handle_t *)pCount;
    dditable._4_4_ = (**(code **)(pfnGetSubVerticesExp + 0x628))(pCount_local,pCount,phSubvertices);
    hVertex_local._4_4_ = dditable._4_4_;
    if (dditable._4_4_ == ZE_RESULT_SUCCESS) {
      local_48 = 0;
      while( true ) {
        bVar2 = false;
        if (pp_Stack_28 != (ze_fabric_vertex_handle_t *)0x0) {
          bVar2 = local_48 < *(uint *)phSubvertices_local;
        }
        if (!bVar2) break;
        poVar1 = singleton_factory_t<object_t<_ze_fabric_vertex_handle_t*>,_ze_fabric_vertex_handle_t*>
                 ::getInstance<_ze_fabric_vertex_handle_t*&,dditable_t*&>
                           ((singleton_factory_t<object_t<_ze_fabric_vertex_handle_t*>,_ze_fabric_vertex_handle_t*>
                             *)(context + 0x360),pp_Stack_28 + local_48,
                            (dditable_t **)&pfnGetSubVerticesExp);
        pp_Stack_28[local_48] = (ze_fabric_vertex_handle_t)poVar1;
        local_48 = local_48 + 1;
      }
      hVertex_local._4_4_ = dditable._4_4_;
    }
  }
  return hVertex_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeFabricVertexGetSubVerticesExp(
        ze_fabric_vertex_handle_t hVertex,              ///< [in] handle of the fabric vertex object
        uint32_t* pCount,                               ///< [in,out] pointer to the number of sub-vertices.
                                                        ///< if count is zero, then the driver shall update the value with the
                                                        ///< total number of sub-vertices available.
                                                        ///< if count is greater than the number of sub-vertices available, then
                                                        ///< the driver shall update the value with the correct number of
                                                        ///< sub-vertices available.
        ze_fabric_vertex_handle_t* phSubvertices        ///< [in,out][optional][range(0, *pCount)] array of handle of sub-vertices.
                                                        ///< if count is less than the number of sub-vertices available, then
                                                        ///< driver shall only retrieve that number of sub-vertices.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<ze_fabric_vertex_object_t*>( hVertex )->dditable;
        auto pfnGetSubVerticesExp = dditable->ze.FabricVertexExp.pfnGetSubVerticesExp;
        if( nullptr == pfnGetSubVerticesExp )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hVertex = reinterpret_cast<ze_fabric_vertex_object_t*>( hVertex )->handle;

        // forward to device-driver
        result = pfnGetSubVerticesExp( hVertex, pCount, phSubvertices );

        if( ZE_RESULT_SUCCESS != result )
            return result;

        try
        {
            // convert driver handles to loader handles
            for( size_t i = 0; ( nullptr != phSubvertices ) && ( i < *pCount ); ++i )
                phSubvertices[ i ] = reinterpret_cast<ze_fabric_vertex_handle_t>(
                    context->ze_fabric_vertex_factory.getInstance( phSubvertices[ i ], dditable ) );
        }
        catch( std::bad_alloc& )
        {
            result = ZE_RESULT_ERROR_OUT_OF_HOST_MEMORY;
        }

        return result;
    }